

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_demo.cpp
# Opt level: O2

void __thiscall despot::RegDemo::RegDemo(RegDemo *this)

{
  allocator<char> local_212;
  allocator<char> local_211 [33];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string map;
  istringstream iss;
  
  despot::DSPOMDP::DSPOMDP(&this->super_DSPOMDP);
  *(undefined8 *)&this->field_0x30 = 0;
  *(undefined8 *)&this->field_0x38 = 0;
  *(undefined8 *)&this->field_0x20 = 0;
  *(undefined8 *)&this->field_0x28 = 0;
  *(undefined8 *)&this->field_0x10 = 0;
  *(undefined8 *)&this->field_0x18 = 0;
  *(undefined ***)this = &PTR__RegDemo_0010fae0;
  *(undefined ***)&this->super_MDP = &PTR__RegDemo_0010fbf0;
  *(undefined ***)&this->super_StateIndexer = &PTR__RegDemo_0010fc40;
  *(undefined ***)&this->super_StatePolicy = &PTR__RegDemo_0010fc78;
  (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  memset(&this->trap_prob_,0,0x94);
  std::__cxx11::string::string<std::allocator<char>>((string *)&iss,"mapSize = 7\n",local_211);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"0 0 0 0.75 0.75 0.75 500\n",&local_212);
  std::operator+(&map,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&iss,
                 &local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&iss);
  std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&map,_S_in);
  Init(this,(istream *)&iss);
  std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
  std::__cxx11::string::~string((string *)&map);
  return;
}

Assistant:

RegDemo::RegDemo() {
	string map = string("mapSize = 7\n") + string("0 0 0 0.75 0.75 0.75 500\n");
	istringstream iss(map);
	Init(iss);
}